

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassFactoryRegistry.cpp
# Opt level: O1

void __thiscall
Lodtalk::ClassFactoryRegistry::registerVMContext(ClassFactoryRegistry *this,VMContext *context)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (this->factories)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    VMContext::instanceClassFactory(context,(AbstractClassFactory *)p_Var1[1]._M_nxt);
  }
  return;
}

Assistant:

void ClassFactoryRegistry::registerVMContext(VMContext *context)
{
    for (auto factory : factories)
        context->instanceClassFactory(factory);
}